

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

term_conflict1 * find_first_subwindow(uint32_t flag)

{
  long lVar1;
  
  lVar1 = 1;
  while( true ) {
    if (lVar1 == 8) {
      return (term_conflict1 *)0x0;
    }
    if (((window_flag[lVar1] & flag) != 0) &&
       ((term_conflict1 *)angband_term[lVar1] != (term_conflict1 *)0x0)) break;
    lVar1 = lVar1 + 1;
  }
  return (term_conflict1 *)angband_term[lVar1];
}

Assistant:

term *find_first_subwindow(uint32_t flag)
{
	int i = 1;

	while (1) {
		if (i >= ANGBAND_TERM_MAX) {
			return NULL;
		}
		if ((window_flag[i] & flag) && angband_term[i]) {
			return angband_term[i];
		}
		++i;
	}
}